

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_matmul.c
# Opt level: O3

rt_function_error_t allocate_batch_matmul_local_context(rt_function_t *f)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  rt_variable_t **pprVar4;
  rt_variable_t *prVar5;
  int *piVar6;
  rt_variable_t *prVar7;
  rt_function_error_t rVar8;
  int iVar9;
  int *piVar10;
  rt_variable_getter p_Var11;
  rt_variable_setter p_Var12;
  code *pcVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  rt_list_t shape;
  
  rVar8 = RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  if ((f->num_of_inputs == 2) &&
     (rVar8 = RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS, f->num_of_outputs == 1)) {
    pvVar3 = f->local_context;
    piVar10 = (int *)(*rt_malloc_func)(0x68);
    if (piVar10 == (int *)0x0) {
      rVar8 = RT_FUNCTION_ERROR_MALLOC;
    }
    else {
      *(int **)f->local_context = piVar10;
      pprVar4 = f->inputs;
      prVar5 = *pprVar4;
      piVar6 = (prVar5->shape).data;
      lVar15 = (long)(prVar5->shape).size;
      iVar9 = piVar6[lVar15 + -2];
      piVar10[2] = iVar9;
      iVar16 = piVar6[lVar15 + -1];
      piVar10[1] = iVar16;
      prVar7 = pprVar4[1];
      piVar6 = (prVar7->shape).data;
      lVar15 = (long)(prVar7->shape).size;
      iVar1 = piVar6[lVar15 + -2];
      piVar10[4] = iVar1;
      iVar2 = piVar6[lVar15 + -1];
      piVar10[3] = iVar2;
      iVar14 = iVar16;
      if (*(char *)((long)pvVar3 + 8) == '\0') {
        iVar14 = iVar9;
      }
      piVar10[6] = iVar14;
      iVar18 = iVar1;
      if (*(char *)((long)pvVar3 + 9) == '\0') {
        iVar18 = iVar2;
      }
      piVar10[5] = iVar18;
      piVar10[7] = iVar16 * iVar9;
      piVar10[8] = iVar2 * iVar1;
      piVar10[9] = iVar18 * iVar14;
      *(rt_variable_t **)(piVar10 + 10) = prVar5;
      p_Var11 = select_getter(prVar5);
      *(rt_variable_getter *)(piVar10 + 0xc) = p_Var11;
      prVar5 = f->inputs[1];
      *(rt_variable_t **)(piVar10 + 0xe) = prVar5;
      p_Var11 = select_getter(prVar5);
      *(rt_variable_getter *)(piVar10 + 0x10) = p_Var11;
      *piVar10 = 1;
      pprVar4 = f->inputs;
      prVar5 = *pprVar4;
      iVar9 = (prVar5->shape).size;
      if (2 < iVar9) {
        piVar6 = (prVar5->shape).data;
        iVar16 = 1;
        uVar17 = 0;
        do {
          iVar16 = iVar16 * piVar6[uVar17];
          *piVar10 = iVar16;
          uVar17 = uVar17 + 1;
        } while (iVar9 - 2 != uVar17);
      }
      prVar5 = pprVar4[1];
      iVar9 = (prVar5->shape).size;
      iVar16 = 1;
      if (2 < iVar9) {
        uVar17 = 0;
        do {
          iVar16 = iVar16 * (prVar5->shape).data[uVar17];
          uVar17 = uVar17 + 1;
        } while (iVar9 - 2 != uVar17);
      }
      prVar5 = *f->outputs;
      *(rt_variable_t **)(piVar10 + 0x12) = prVar5;
      p_Var11 = select_getter(prVar5);
      *(rt_variable_getter *)(piVar10 + 0x14) = p_Var11;
      p_Var12 = select_setter(*(rt_variable_t **)(piVar10 + 0x12));
      *(rt_variable_setter *)(piVar10 + 0x16) = p_Var12;
      shape._4_4_ = 0;
      shape.size = ((*f->outputs)->shape).size;
      shape.data = ((*f->outputs)->shape).data;
      iVar9 = calc_shape_size(shape);
      piVar10[0x18] = iVar9;
      rVar8 = RT_FUNCTION_ERROR_INVALID_SHAPE;
      if (*piVar10 == iVar16) {
        if ((((*(byte *)(*(long *)(piVar10 + 10) + 0x10) & 0xf) == 0) &&
            ((*(byte *)(*(long *)(piVar10 + 0xe) + 0x10) & 0xf) == 0)) &&
           ((*(byte *)(*(long *)(piVar10 + 0x12) + 0x10) & 0xf) == 0)) {
          pcVar13 = exec_batch_matmul;
        }
        else {
          pcVar13 = exec_batch_matmul_generic;
        }
        f->exec_func = pcVar13;
        rVar8 = RT_FUNCTION_ERROR_NOERROR;
      }
    }
  }
  return rVar8;
}

Assistant:

rt_function_error_t allocate_batch_matmul_local_context(rt_function_t *f) {
  if (f->num_of_inputs != 2) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_INPUTS;
  }
  if (f->num_of_outputs != 1) {
    return RT_FUNCTION_ERROR_INVALID_NUM_OF_OUTPUTS;
  }

  batch_matmul_local_context_t *context =
      (batch_matmul_local_context_t *)(f->local_context);
  batch_matmul_private_t *p = rt_malloc_func(sizeof(batch_matmul_private_t));
  if (p == 0) {
    return RT_FUNCTION_ERROR_MALLOC;
  }
  ((batch_matmul_local_context_t *)(f->local_context))->data = (void *)p;
  p->row_a = f->inputs[0]->shape.data[f->inputs[0]->shape.size - 2];
  p->col_a = f->inputs[0]->shape.data[f->inputs[0]->shape.size - 1];
  p->row_b = f->inputs[1]->shape.data[f->inputs[1]->shape.size - 2];
  p->col_b = f->inputs[1]->shape.data[f->inputs[1]->shape.size - 1];
  p->row_y = context->transpose_a ? p->col_a : p->row_a;
  p->col_y = context->transpose_b ? p->row_b : p->col_b;
  p->offset_a = p->row_a * p->col_a;
  p->offset_b = p->row_b * p->col_b;
  p->offset_y = p->row_y * p->col_y;

  p->input_a = f->inputs[0];
  p->get_input_a = select_getter(p->input_a);
  p->input_b = f->inputs[1];
  p->get_input_b = select_getter(p->input_b);

  p->samples = 1;
  for (int i = 0; i < f->inputs[0]->shape.size - 2; ++i) {
    p->samples *= f->inputs[0]->shape.data[i];
  }

  int samples_b = 1;
  for (int j = 0; j < f->inputs[1]->shape.size - 2; ++j) {
    samples_b *= f->inputs[1]->shape.data[j];
  }

  p->output = f->outputs[0];
  p->get_output = select_getter(p->output);
  p->set_output = select_setter(p->output);
  p->output_size = calc_shape_size(f->outputs[0]->shape);

  if (p->samples != samples_b) {
    return RT_FUNCTION_ERROR_INVALID_SHAPE;
  }
  if (p->input_a->type == NN_DATA_TYPE_FLOAT &&
      p->input_b->type == NN_DATA_TYPE_FLOAT &&
      p->output->type == NN_DATA_TYPE_FLOAT) {
#ifdef CONFIG_BATCHMATMUL_FLOAT32
    f->exec_func = exec_batch_matmul;
#endif /* CONFIG_BATCHMATMUL_FLOAT32 */
  } else {
#ifdef CONFIG_BATCHMATMUL_GENERIC
    f->exec_func = exec_batch_matmul_generic;
#endif /* CONFIG_BATCHMATMUL_GENERIC */
  }
  return RT_FUNCTION_ERROR_NOERROR;
}